

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cpp
# Opt level: O0

int main(void)

{
  Severity SVar1;
  SessionWriter *pSVar2;
  data_ref pacVar3;
  Session *this;
  uint64_t _binlog_sid_v_6;
  uint64_t _binlog_sid_v_5;
  uint64_t _binlog_sid_v_4;
  uint64_t _binlog_sid_v_3;
  uint64_t _binlog_sid_v_2;
  uint64_t _binlog_sid_v_1;
  uint64_t _binlog_sid_v;
  memory_order __b_12;
  memory_order __b_10;
  memory_order __b_8;
  memory_order __b_6;
  memory_order __b_4;
  memory_order __b_2;
  memory_order __b;
  memory_order __b_13;
  memory_order __b_11;
  memory_order __b_9;
  memory_order __b_7;
  memory_order __b_5;
  memory_order __b_3;
  memory_order __b_1;
  char (*in_stack_fffffffffffff3e8) [11];
  EventSource *in_stack_fffffffffffff3f0;
  char (*in_stack_fffffffffffff3f8) [11];
  __atomic_base<unsigned_long> eventSourceId;
  atomic<unsigned_long> *in_stack_fffffffffffff400;
  EventSource *in_stack_fffffffffffff418;
  EventSource *eventSource;
  Session *in_stack_fffffffffffff420;
  undefined1 local_74d [7];
  cx_string<1UL> local_746;
  allocator local_744;
  allocator local_743;
  allocator local_742;
  allocator local_741;
  undefined8 local_740;
  undefined2 local_738;
  string local_730 [32];
  string local_710 [32];
  string local_6f0 [32];
  undefined8 local_6d0;
  string local_6c8 [32];
  string local_6a8 [32];
  __atomic_base<unsigned_long> local_688;
  undefined1 local_67a;
  undefined1 local_679;
  undefined1 local_678;
  undefined1 local_677;
  allocator local_676;
  cx_string<0UL> local_675;
  allocator local_674;
  allocator local_673;
  allocator local_672;
  allocator local_671;
  undefined8 local_670;
  undefined2 local_668;
  string local_660 [32];
  string local_640 [32];
  string local_620 [32];
  undefined8 local_600;
  string local_5f8 [32];
  string local_5d8 [32];
  __atomic_base<unsigned_long> local_5b8;
  undefined1 local_5aa;
  undefined1 local_5a9;
  undefined1 local_5a8;
  undefined1 local_5a7;
  allocator local_5a6;
  cx_string<0UL> local_5a5;
  allocator local_5a4;
  allocator local_5a3;
  allocator local_5a2;
  allocator local_5a1;
  undefined8 local_5a0;
  undefined2 local_598;
  string local_590 [32];
  string local_570 [32];
  string local_550 [32];
  undefined8 local_530;
  string local_528 [32];
  string local_508 [32];
  __atomic_base<unsigned_long> local_4e8;
  undefined1 local_4da;
  undefined1 local_4d9;
  undefined1 local_4d8;
  undefined1 local_4d7;
  allocator local_4d6;
  cx_string<0UL> local_4d5;
  allocator local_4d4;
  allocator local_4d3;
  allocator local_4d2;
  allocator local_4d1;
  undefined8 local_4d0;
  undefined2 local_4c8;
  string local_4c0 [32];
  string local_4a0 [32];
  string local_480 [32];
  undefined8 local_460;
  string local_458 [32];
  string local_438 [32];
  __atomic_base<unsigned_long> local_418;
  undefined1 local_40a;
  undefined1 local_409;
  undefined1 local_408;
  undefined1 local_407;
  allocator local_406;
  cx_string<0UL> local_405;
  allocator local_404;
  allocator local_403;
  allocator local_402;
  allocator local_401;
  undefined8 local_400;
  undefined2 local_3f8;
  string local_3f0 [32];
  string local_3d0 [32];
  string local_3b0 [32];
  undefined8 local_390;
  string local_388 [32];
  string local_368 [32];
  __atomic_base<unsigned_long> local_348;
  undefined1 local_33a;
  undefined1 local_339;
  undefined1 local_338;
  undefined1 local_337;
  allocator local_336;
  cx_string<0UL> local_335;
  allocator local_334;
  allocator local_333;
  allocator local_332;
  allocator local_331;
  undefined8 local_330;
  undefined2 local_328;
  string local_320 [32];
  string local_300 [32];
  string local_2e0 [32];
  undefined8 local_2c0;
  string local_2b8 [32];
  string local_298 [32];
  __atomic_base<unsigned_long> local_278;
  undefined1 local_26d;
  undefined1 local_26c;
  undefined1 local_26b;
  undefined1 local_26a;
  allocator local_269;
  cx_string<0UL> local_268;
  allocator local_267;
  allocator local_266;
  allocator local_265 [20];
  allocator local_251;
  undefined8 local_250;
  undefined2 local_248;
  string local_240 [32];
  string local_220 [32];
  string local_200 [32];
  undefined8 local_1e0;
  string local_1d8 [32];
  string local_1b8 [32];
  __atomic_base<unsigned_long> local_198;
  undefined4 local_18c;
  __atomic_base<unsigned_long> local_188;
  memory_order local_180;
  undefined4 local_17c;
  atomic<unsigned_long> *local_178;
  __atomic_base<unsigned_long> local_170;
  memory_order local_168;
  undefined4 local_164;
  atomic<unsigned_long> *local_160;
  __atomic_base<unsigned_long> local_158;
  memory_order local_150;
  undefined4 local_14c;
  atomic<unsigned_long> *local_148;
  __atomic_base<unsigned_long> local_140;
  memory_order local_138;
  undefined4 local_134;
  atomic<unsigned_long> *local_130;
  __atomic_base<unsigned_long> local_128;
  memory_order local_120;
  undefined4 local_11c;
  atomic<unsigned_long> *local_118;
  __atomic_base<unsigned_long> local_110;
  memory_order local_108;
  undefined4 local_104;
  atomic<unsigned_long> *local_100;
  __atomic_base<unsigned_long> local_f8;
  memory_order local_f0;
  undefined4 local_ec;
  atomic<unsigned_long> *local_e8;
  Session *local_e0;
  memory_order local_d8;
  int local_d4;
  Session *local_d0;
  atomic<unsigned_long> *local_c8;
  __int_type local_c0;
  memory_order local_b8;
  int local_b4;
  __atomic_base<unsigned_long> local_b0;
  atomic<unsigned_long> *local_a8;
  __int_type local_a0;
  memory_order local_98;
  int local_94;
  __atomic_base<unsigned_long> local_90;
  atomic<unsigned_long> *local_88;
  __int_type local_80;
  memory_order local_78;
  int local_74;
  __atomic_base<unsigned_long> local_70;
  atomic<unsigned_long> *local_68;
  __int_type local_60;
  memory_order local_58;
  int local_54;
  __atomic_base<unsigned_long> local_50;
  atomic<unsigned_long> *local_48;
  __int_type local_40;
  memory_order local_38;
  int local_34;
  __atomic_base<unsigned_long> local_30;
  atomic<unsigned_long> *local_28;
  __int_type local_20;
  memory_order local_18;
  int local_14;
  __atomic_base<unsigned_long> local_10;
  atomic<unsigned_long> *local_8;
  
  local_18c = 0;
  pSVar2 = binlog::default_thread_local_writer();
  binlog::SessionWriter::session(pSVar2);
  SVar1 = binlog::Session::minSeverity((Session *)0x1024b7);
  if (SVar1 < 0x21) {
    local_e8 = &main::_binlog_sid;
    local_ec = 0;
    local_f0 = std::operator&(memory_order_relaxed,__memory_order_mask);
    local_f8 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    local_198 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar2 = binlog::default_thread_local_writer();
      binlog::SessionWriter::session(pSVar2);
      local_250 = 0;
      local_248 = 0x20;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_240,"main",&local_251);
      local_26d = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_220,"main",local_265);
      local_26c = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_200,
                 "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/test/integration/Logging.cpp"
                 ,&local_266);
      local_26b = 1;
      local_1e0 = 7;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1d8,"Hello",&local_267);
      local_26a = 1;
      local_268 = binlog::detail::concatenated_tags<char_const(&)[6]>
                            ((char (*) [6])in_stack_fffffffffffff3e8);
      pacVar3 = mserialize::cx_string<0UL>::data(&local_268);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1b8,*pacVar3,&local_269);
      local_26a = 0;
      local_26b = 0;
      local_26c = 0;
      local_26d = 0;
      local_198._M_i =
           binlog::Session::addEventSource(in_stack_fffffffffffff420,in_stack_fffffffffffff418);
      binlog::EventSource::~EventSource(in_stack_fffffffffffff3f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_269);
      std::allocator<char>::~allocator((allocator<char> *)&local_267);
      std::allocator<char>::~allocator((allocator<char> *)&local_266);
      std::allocator<char>::~allocator((allocator<char> *)local_265);
      std::allocator<char>::~allocator((allocator<char> *)&local_251);
      local_8 = &main::_binlog_sid;
      local_10._M_i = local_198._M_i;
      local_14 = 5;
      local_18 = std::operator&(memory_order_seq_cst,__memory_order_mask);
      local_20 = local_10._M_i;
      if ((local_14 != 3) && (local_14 == 5)) {
        LOCK();
        UNLOCK();
      }
      main::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)local_10._M_i;
    }
    binlog::default_thread_local_writer();
    binlog::clockNow();
    binlog::detail::addEventIgnoreFirst<binlog::SessionWriter,char_const(&)[6]>
              ((SessionWriter *)in_stack_fffffffffffff400,(uint64_t)in_stack_fffffffffffff3f8,
               (uint64_t)in_stack_fffffffffffff3f0,(char (*) [6])in_stack_fffffffffffff3e8);
  }
  pSVar2 = binlog::default_thread_local_writer();
  binlog::SessionWriter::session(pSVar2);
  SVar1 = binlog::Session::minSeverity((Session *)0x102aa7);
  if (SVar1 < 0x41) {
    local_100 = &main::_binlog_sid;
    local_104 = 0;
    local_108 = std::operator&(memory_order_relaxed,__memory_order_mask);
    local_110 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    local_278 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar2 = binlog::default_thread_local_writer();
      binlog::SessionWriter::session(pSVar2);
      local_330 = 0;
      local_328 = 0x40;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_320,"main",&local_331);
      local_33a = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_300,"main",&local_332);
      local_339 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_2e0,
                 "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/test/integration/Logging.cpp"
                 ,&local_333);
      local_338 = 1;
      local_2c0 = 9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2b8,"Hello",&local_334);
      local_337 = 1;
      local_335 = binlog::detail::concatenated_tags<char_const(&)[6]>
                            ((char (*) [6])in_stack_fffffffffffff3e8);
      pacVar3 = mserialize::cx_string<0UL>::data(&local_335);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_298,*pacVar3,&local_336);
      local_337 = 0;
      local_338 = 0;
      local_339 = 0;
      local_33a = 0;
      local_278._M_i =
           binlog::Session::addEventSource(in_stack_fffffffffffff420,in_stack_fffffffffffff418);
      binlog::EventSource::~EventSource(in_stack_fffffffffffff3f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_336);
      std::allocator<char>::~allocator((allocator<char> *)&local_334);
      std::allocator<char>::~allocator((allocator<char> *)&local_333);
      std::allocator<char>::~allocator((allocator<char> *)&local_332);
      std::allocator<char>::~allocator((allocator<char> *)&local_331);
      local_28 = &main::_binlog_sid;
      local_30._M_i = local_278._M_i;
      local_34 = 5;
      local_38 = std::operator&(memory_order_seq_cst,__memory_order_mask);
      local_40 = local_30._M_i;
      if ((local_34 != 3) && (local_34 == 5)) {
        LOCK();
        UNLOCK();
      }
      main::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)local_30._M_i;
    }
    binlog::default_thread_local_writer();
    binlog::clockNow();
    binlog::detail::addEventIgnoreFirst<binlog::SessionWriter,char_const(&)[6]>
              ((SessionWriter *)in_stack_fffffffffffff400,(uint64_t)in_stack_fffffffffffff3f8,
               (uint64_t)in_stack_fffffffffffff3f0,(char (*) [6])in_stack_fffffffffffff3e8);
  }
  pSVar2 = binlog::default_thread_local_writer();
  binlog::SessionWriter::session(pSVar2);
  SVar1 = binlog::Session::minSeverity((Session *)0x103097);
  if (SVar1 < 0x81) {
    local_118 = &main::_binlog_sid;
    local_11c = 0;
    local_120 = std::operator&(memory_order_relaxed,__memory_order_mask);
    local_128 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    local_348 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar2 = binlog::default_thread_local_writer();
      binlog::SessionWriter::session(pSVar2);
      local_400 = 0;
      local_3f8 = 0x80;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3f0,"main",&local_401);
      local_40a = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3d0,"main",&local_402);
      local_409 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_3b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/test/integration/Logging.cpp"
                 ,&local_403);
      local_408 = 1;
      local_390 = 0xb;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_388,"Hello",&local_404);
      local_407 = 1;
      local_405 = binlog::detail::concatenated_tags<char_const(&)[6]>
                            ((char (*) [6])in_stack_fffffffffffff3e8);
      pacVar3 = mserialize::cx_string<0UL>::data(&local_405);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_368,*pacVar3,&local_406);
      local_407 = 0;
      local_408 = 0;
      local_409 = 0;
      local_40a = 0;
      local_348._M_i =
           binlog::Session::addEventSource(in_stack_fffffffffffff420,in_stack_fffffffffffff418);
      binlog::EventSource::~EventSource(in_stack_fffffffffffff3f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_406);
      std::allocator<char>::~allocator((allocator<char> *)&local_404);
      std::allocator<char>::~allocator((allocator<char> *)&local_403);
      std::allocator<char>::~allocator((allocator<char> *)&local_402);
      std::allocator<char>::~allocator((allocator<char> *)&local_401);
      local_48 = &main::_binlog_sid;
      local_50._M_i = local_348._M_i;
      local_54 = 5;
      local_58 = std::operator&(memory_order_seq_cst,__memory_order_mask);
      local_60 = local_50._M_i;
      if ((local_54 != 3) && (local_54 == 5)) {
        LOCK();
        UNLOCK();
      }
      main::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)local_50._M_i;
    }
    binlog::default_thread_local_writer();
    binlog::clockNow();
    binlog::detail::addEventIgnoreFirst<binlog::SessionWriter,char_const(&)[6]>
              ((SessionWriter *)in_stack_fffffffffffff400,(uint64_t)in_stack_fffffffffffff3f8,
               (uint64_t)in_stack_fffffffffffff3f0,(char (*) [6])in_stack_fffffffffffff3e8);
  }
  pSVar2 = binlog::default_thread_local_writer();
  binlog::SessionWriter::session(pSVar2);
  SVar1 = binlog::Session::minSeverity((Session *)0x103687);
  if (SVar1 < 0x101) {
    local_130 = &main::_binlog_sid;
    local_134 = 0;
    local_138 = std::operator&(memory_order_relaxed,__memory_order_mask);
    local_140 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    local_418 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar2 = binlog::default_thread_local_writer();
      binlog::SessionWriter::session(pSVar2);
      local_4d0 = 0;
      local_4c8 = 0x100;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_4c0,"main",&local_4d1);
      local_4da = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_4a0,"main",&local_4d2);
      local_4d9 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_480,
                 "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/test/integration/Logging.cpp"
                 ,&local_4d3);
      local_4d8 = 1;
      local_460 = 0xd;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_458,"Hello",&local_4d4);
      local_4d7 = 1;
      local_4d5 = binlog::detail::concatenated_tags<char_const(&)[6]>
                            ((char (*) [6])in_stack_fffffffffffff3e8);
      pacVar3 = mserialize::cx_string<0UL>::data(&local_4d5);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_438,*pacVar3,&local_4d6);
      local_4d7 = 0;
      local_4d8 = 0;
      local_4d9 = 0;
      local_4da = 0;
      local_418._M_i =
           binlog::Session::addEventSource(in_stack_fffffffffffff420,in_stack_fffffffffffff418);
      binlog::EventSource::~EventSource(in_stack_fffffffffffff3f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_4d6);
      std::allocator<char>::~allocator((allocator<char> *)&local_4d4);
      std::allocator<char>::~allocator((allocator<char> *)&local_4d3);
      std::allocator<char>::~allocator((allocator<char> *)&local_4d2);
      std::allocator<char>::~allocator((allocator<char> *)&local_4d1);
      local_68 = &main::_binlog_sid;
      local_70._M_i = local_418._M_i;
      local_74 = 5;
      local_78 = std::operator&(memory_order_seq_cst,__memory_order_mask);
      local_80 = local_70._M_i;
      if ((local_74 != 3) && (local_74 == 5)) {
        LOCK();
        UNLOCK();
      }
      main::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)local_70._M_i;
    }
    binlog::default_thread_local_writer();
    binlog::clockNow();
    binlog::detail::addEventIgnoreFirst<binlog::SessionWriter,char_const(&)[6]>
              ((SessionWriter *)in_stack_fffffffffffff400,(uint64_t)in_stack_fffffffffffff3f8,
               (uint64_t)in_stack_fffffffffffff3f0,(char (*) [6])in_stack_fffffffffffff3e8);
  }
  pSVar2 = binlog::default_thread_local_writer();
  binlog::SessionWriter::session(pSVar2);
  SVar1 = binlog::Session::minSeverity((Session *)0x103c77);
  if (SVar1 < 0x201) {
    local_148 = &main::_binlog_sid;
    local_14c = 0;
    local_150 = std::operator&(memory_order_relaxed,__memory_order_mask);
    local_158 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    local_4e8 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar2 = binlog::default_thread_local_writer();
      binlog::SessionWriter::session(pSVar2);
      local_5a0 = 0;
      local_598 = 0x200;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_590,"main",&local_5a1);
      local_5aa = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_570,"main",&local_5a2);
      local_5a9 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_550,
                 "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/test/integration/Logging.cpp"
                 ,&local_5a3);
      local_5a8 = 1;
      local_530 = 0xf;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_528,"Hello",&local_5a4);
      local_5a7 = 1;
      local_5a5 = binlog::detail::concatenated_tags<char_const(&)[6]>
                            ((char (*) [6])in_stack_fffffffffffff3e8);
      pacVar3 = mserialize::cx_string<0UL>::data(&local_5a5);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_508,*pacVar3,&local_5a6);
      local_5a7 = 0;
      local_5a8 = 0;
      local_5a9 = 0;
      local_5aa = 0;
      local_4e8._M_i =
           binlog::Session::addEventSource(in_stack_fffffffffffff420,in_stack_fffffffffffff418);
      binlog::EventSource::~EventSource(in_stack_fffffffffffff3f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_5a6);
      std::allocator<char>::~allocator((allocator<char> *)&local_5a4);
      std::allocator<char>::~allocator((allocator<char> *)&local_5a3);
      std::allocator<char>::~allocator((allocator<char> *)&local_5a2);
      std::allocator<char>::~allocator((allocator<char> *)&local_5a1);
      local_88 = &main::_binlog_sid;
      local_90._M_i = local_4e8._M_i;
      local_94 = 5;
      local_98 = std::operator&(memory_order_seq_cst,__memory_order_mask);
      local_a0 = local_90._M_i;
      if ((local_94 != 3) && (local_94 == 5)) {
        LOCK();
        UNLOCK();
      }
      main::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)local_90._M_i;
    }
    binlog::default_thread_local_writer();
    binlog::clockNow();
    binlog::detail::addEventIgnoreFirst<binlog::SessionWriter,char_const(&)[6]>
              ((SessionWriter *)in_stack_fffffffffffff400,(uint64_t)in_stack_fffffffffffff3f8,
               (uint64_t)in_stack_fffffffffffff3f0,(char (*) [6])in_stack_fffffffffffff3e8);
  }
  pSVar2 = binlog::default_thread_local_writer();
  binlog::SessionWriter::session(pSVar2);
  SVar1 = binlog::Session::minSeverity((Session *)0x104267);
  if (SVar1 < 0x401) {
    local_160 = &main::_binlog_sid;
    local_164 = 0;
    local_168 = std::operator&(memory_order_relaxed,__memory_order_mask);
    local_170 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    local_5b8 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar2 = binlog::default_thread_local_writer();
      binlog::SessionWriter::session(pSVar2);
      local_670 = 0;
      local_668 = 0x400;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_660,"main",&local_671);
      local_67a = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_640,"main",&local_672);
      local_679 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_620,
                 "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/test/integration/Logging.cpp"
                 ,&local_673);
      local_678 = 1;
      local_600 = 0x11;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_5f8,"Hello",&local_674);
      local_677 = 1;
      local_675 = binlog::detail::concatenated_tags<char_const(&)[6]>
                            ((char (*) [6])in_stack_fffffffffffff3e8);
      pacVar3 = mserialize::cx_string<0UL>::data(&local_675);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_5d8,*pacVar3,&local_676);
      local_677 = 0;
      local_678 = 0;
      local_679 = 0;
      local_67a = 0;
      local_5b8._M_i =
           binlog::Session::addEventSource(in_stack_fffffffffffff420,in_stack_fffffffffffff418);
      binlog::EventSource::~EventSource(in_stack_fffffffffffff3f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_676);
      std::allocator<char>::~allocator((allocator<char> *)&local_674);
      std::allocator<char>::~allocator((allocator<char> *)&local_673);
      std::allocator<char>::~allocator((allocator<char> *)&local_672);
      std::allocator<char>::~allocator((allocator<char> *)&local_671);
      local_a8 = &main::_binlog_sid;
      local_b0._M_i = local_5b8._M_i;
      local_b4 = 5;
      local_b8 = std::operator&(memory_order_seq_cst,__memory_order_mask);
      local_c0 = local_b0._M_i;
      if ((local_b4 != 3) && (local_b4 == 5)) {
        LOCK();
        UNLOCK();
      }
      main::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)local_b0._M_i;
    }
    binlog::default_thread_local_writer();
    binlog::clockNow();
    binlog::detail::addEventIgnoreFirst<binlog::SessionWriter,char_const(&)[6]>
              ((SessionWriter *)in_stack_fffffffffffff400,(uint64_t)in_stack_fffffffffffff3f8,
               (uint64_t)in_stack_fffffffffffff3f0,(char (*) [6])in_stack_fffffffffffff3e8);
  }
  pSVar2 = binlog::default_thread_local_writer();
  binlog::SessionWriter::session(pSVar2);
  SVar1 = binlog::Session::minSeverity((Session *)0x104857);
  if (SVar1 < 0x81) {
    local_178 = &main::_binlog_sid;
    local_17c = 0;
    local_180 = std::operator&(memory_order_relaxed,__memory_order_mask);
    local_188 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    local_688 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar2 = binlog::default_thread_local_writer();
      binlog::SessionWriter::session(pSVar2);
      local_740._0_3_ = 0;
      local_740._3_1_ = (string)0x0;
      local_740._4_4_ = 0;
      local_738 = 0x80;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_730,"main",&local_741);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_710,"main",&local_742);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_6f0,
                 "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/test/integration/Logging.cpp"
                 ,&local_743);
      local_6d0 = 0x15;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_6c8,"Result: {}",&local_744);
      local_74d._1_4_ = 0x2a;
      local_746 = binlog::detail::concatenated_tags<char_const(&)[11],int>
                            (in_stack_fffffffffffff3f8,(int *)in_stack_fffffffffffff3f0);
      this = (Session *)mserialize::cx_string<1UL>::data(&local_746);
      eventSource = (EventSource *)local_74d;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_6a8,(char *)this,(allocator *)eventSource);
      local_688._M_i = binlog::Session::addEventSource(this,eventSource);
      binlog::EventSource::~EventSource(in_stack_fffffffffffff3f0);
      std::allocator<char>::~allocator((allocator<char> *)local_74d);
      std::allocator<char>::~allocator((allocator<char> *)&local_744);
      std::allocator<char>::~allocator((allocator<char> *)&local_743);
      std::allocator<char>::~allocator((allocator<char> *)&local_742);
      std::allocator<char>::~allocator((allocator<char> *)&local_741);
      local_c8 = &main::_binlog_sid;
      local_d0 = (Session *)local_688._M_i;
      local_d4 = 5;
      in_stack_fffffffffffff400 = &main::_binlog_sid;
      local_d8 = std::operator&(memory_order_seq_cst,__memory_order_mask);
      local_e0 = local_d0;
      if (local_d4 == 3) {
        ((SessionWriter *)in_stack_fffffffffffff400)->_session = local_d0;
      }
      else if (local_d4 == 5) {
        LOCK();
        ((SessionWriter *)in_stack_fffffffffffff400)->_session = local_d0;
        UNLOCK();
      }
      else {
        ((SessionWriter *)in_stack_fffffffffffff400)->_session = local_d0;
      }
    }
    in_stack_fffffffffffff3f0 = (EventSource *)binlog::default_thread_local_writer();
    eventSourceId._M_i = local_688._M_i;
    binlog::clockNow();
    binlog::detail::addEventIgnoreFirst<binlog::SessionWriter,char_const(&)[11],int>
              ((SessionWriter *)in_stack_fffffffffffff400,eventSourceId._M_i,
               (uint64_t)in_stack_fffffffffffff3f0,in_stack_fffffffffffff3e8,(int *)0x104de9);
  }
  binlog::consume<std::ostream>
            ((basic_ostream<char,_std::char_traits<char>_> *)in_stack_fffffffffffff3f0);
  return 0;
}

Assistant:

int main()
{
  BINLOG_TRACE("Hello");
  // Outputs: TRAC Hello
  BINLOG_DEBUG("Hello");
  // Outputs: DEBG Hello
  BINLOG_INFO("Hello");
  // Outputs: INFO Hello
  BINLOG_WARN("Hello");
  // Outputs: WARN Hello
  BINLOG_ERROR("Hello");
  // Outputs: ERRO Hello
  BINLOG_CRITICAL("Hello");
  // Outputs: CRIT Hello

  //[log
  BINLOG_INFO("Result: {}", 42);
  // Outputs: INFO Result: 42
  //]

  binlog::consume(std::cout);
  return 0;
}